

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O3

void __thiscall
pstore::storage::storage<pstore::file::file_handle>
          (storage *this,shared_ptr<pstore::file::file_handle> *file)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> __s;
  system_page_size *this_00;
  pointer *__ptr_1;
  pointer __p;
  shared_ptr<pstore::file::file_handle> local_30;
  
  __s._M_head_impl = (array<pstore::sat_entry,_65536UL> *)operator_new(0x200000);
  memset(__s._M_head_impl,0,0x200000);
  (this->sat_)._M_t.
  super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl =
       __s._M_head_impl;
  (this->file_).super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((file->super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        super_file_base;
  p_Var1 = (file->super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->file_).super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this_00 = (system_page_size *)operator_new(0x10);
  (this_00->super_system_page_size_interface)._vptr_system_page_size_interface = (_func_int **)0x0;
  *(undefined8 *)&this_00->size_ = 0;
  system_page_size::system_page_size(this_00);
  local_30.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->page_size_)._M_t.
  super___uniq_ptr_impl<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
  .super__Head_base<0UL,_pstore::system_page_size_interface_*,_false>._M_head_impl =
       (system_page_size_interface *)this_00;
  std::unique_ptr<pstore::system_page_size,_std::default_delete<pstore::system_page_size>_>::
  ~unique_ptr((unique_ptr<pstore::system_page_size,_std::default_delete<pstore::system_page_size>_>
               *)&local_30);
  local_30.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (file->super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_30.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (file->super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_30.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_30.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_30.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  region::get_factory((region *)&this->region_factory_,&local_30,0x100000000,0x400000);
  if (local_30.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (*((this->region_factory_)._M_t.
     super___uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>.
     _M_t.
     super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>
     .super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl)->_vptr_factory[2])
            (&this->regions_);
  return;
}

Assistant:

explicit storage (std::shared_ptr<File> const & file)
                : file_{std::static_pointer_cast<file::file_base> (file)}
                , region_factory_{region::get_factory (
                      std::static_pointer_cast<file::file_handle> (file), full_region_size,
                      min_region_size)}
                , regions_{region_factory_->init ()} {}